

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

Int128 __thiscall ClipperLib::Int128::operator*(Int128 *this,Int128 *rhs)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  ulong *in_RDX;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Int128 *tmp;
  ulong uVar9;
  ulong uVar10;
  Int128 IVar11;
  
  uVar2 = rhs->hi;
  if ((1 < uVar2 + 1) || (uVar1 = *in_RDX, 1 < uVar1 + 1)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "Int128 operator*: overflow error";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  this->hi = uVar2;
  lVar5 = rhs->lo;
  this->lo = lVar5;
  if ((long)uVar2 < 0) {
    if (lVar5 == 0) {
      uVar8 = -uVar2;
    }
    else {
      this->lo = -lVar5;
      uVar8 = ~uVar2;
    }
    this->hi = uVar8;
  }
  uVar4 = this->lo & 0xffffffff;
  uVar9 = (ulong)this->lo >> 0x20;
  uVar8 = in_RDX[1];
  this->hi = *in_RDX;
  this->lo = uVar8;
  uVar8 = this->hi;
  if ((long)uVar8 < 0) {
    if (this->lo == 0) {
      uVar8 = -uVar8;
    }
    else {
      this->lo = -this->lo;
      uVar8 = ~uVar8;
    }
    this->hi = uVar8;
  }
  uVar6 = this->lo & 0xffffffff;
  uVar8 = (ulong)this->lo >> 0x20;
  uVar10 = uVar6 * uVar4;
  uVar4 = uVar8 * uVar4 + uVar6 * uVar9;
  lVar7 = (uVar4 >> 0x20) + uVar8 * uVar9;
  this->hi = lVar7;
  uVar4 = uVar4 << 0x20;
  lVar5 = uVar4 + uVar10;
  this->lo = lVar5;
  if (CARRY8(uVar4,uVar10)) {
    lVar7 = lVar7 + 1;
    this->hi = lVar7;
  }
  if ((long)(uVar1 ^ uVar2) < 0) {
    if (lVar5 == 0) {
      if (this->hi == 0) goto LAB_006e7744;
      uVar2 = -this->hi;
    }
    else {
      this->lo = -lVar5;
      uVar2 = ~this->hi;
    }
    this->hi = uVar2;
  }
LAB_006e7744:
  IVar11.lo = lVar7;
  IVar11.hi = (long64)this;
  return IVar11;
}

Assistant:

Int128 operator * (const Int128 &rhs) const
    {
      if ( !(hi == 0 || hi == -1) || !(rhs.hi == 0 || rhs.hi == -1))
        throw "Int128 operator*: overflow error";
      bool negate = (hi < 0) != (rhs.hi < 0);

      Int128 tmp(*this);
      if (tmp.hi < 0) Negate(tmp);
      ulong64 int1Hi = ulong64(tmp.lo) >> 32;
      ulong64 int1Lo = ulong64(tmp.lo & 0xFFFFFFFF);

      tmp = rhs;
      if (tmp.hi < 0) Negate(tmp);
      ulong64 int2Hi = ulong64(tmp.lo) >> 32;
      ulong64 int2Lo = ulong64(tmp.lo & 0xFFFFFFFF);

      //nb: see comments in clipper.pas
      ulong64 a = int1Hi * int2Hi;
      ulong64 b = int1Lo * int2Lo;
      ulong64 c = int1Hi * int2Lo + int1Lo * int2Hi;

      tmp.hi = long64(a + (c >> 32));
      tmp.lo = long64(c << 32);
      tmp.lo += long64(b);
      if (ulong64(tmp.lo) < b) tmp.hi++;
      if (negate) Negate(tmp);
      return tmp;
    }